

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifReduce.c
# Opt level: O0

void If_ManImproveNodeExpand
               (If_Man_t *p,If_Obj_t *pObj,int nLimit,Vec_Ptr_t *vFront,Vec_Ptr_t *vFrontOld,
               Vec_Ptr_t *vVisited)

{
  int iVar1;
  int iVar2;
  If_Cut_t *pCut_00;
  uint *puVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float AreaAft;
  float AreaBef;
  float DelayOld;
  int i;
  int CostAft;
  int CostBef;
  If_Cut_t *pCut;
  If_Obj_t *pFanin;
  Vec_Ptr_t *vVisited_local;
  Vec_Ptr_t *vFrontOld_local;
  Vec_Ptr_t *vFront_local;
  int nLimit_local;
  If_Obj_t *pObj_local;
  If_Man_t *p_local;
  
  pCut_00 = If_ObjCutBest(pObj);
  fVar4 = If_CutDelay(p,pObj,pCut_00);
  pCut_00->Delay = fVar4;
  if (pObj->Required + p->fEpsilon < pCut_00->Delay) {
    __assert_fail("pCut->Delay <= pObj->Required + p->fEpsilon",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifReduce.c"
                  ,0x88,
                  "void If_ManImproveNodeExpand(If_Man_t *, If_Obj_t *, int, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                 );
  }
  if (pObj->nRefs != 0) {
    fVar4 = pCut_00->Delay;
    fVar5 = If_CutAreaRefed(p,pCut_00);
    If_ManImproveNodePrepare(p,pObj,nLimit,vFront,vFrontOld,vVisited);
    If_CutAreaDeref(p,pCut_00);
    iVar1 = If_ManImproveCutCost(p,vFront);
    If_ManImproveNodeFaninCompact(p,pObj,nLimit,vFront,vVisited);
    iVar2 = If_ManImproveCutCost(p,vFront);
    If_CutAreaRef(p,pCut_00);
    if (iVar1 < iVar2) {
      __assert_fail("CostBef >= CostAft",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifReduce.c"
                    ,0x99,
                    "void If_ManImproveNodeExpand(If_Man_t *, If_Obj_t *, int, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                   );
    }
    for (AreaBef = 0.0; iVar1 = Vec_PtrSize(vVisited), (int)AreaBef < iVar1;
        AreaBef = (float)((int)AreaBef + 1)) {
      puVar3 = (uint *)Vec_PtrEntry(vVisited,(int)AreaBef);
      *puVar3 = *puVar3 & 0xfffffeff;
    }
    If_ManImproveNodeUpdate(p,pObj,vFront);
    fVar6 = If_CutDelay(p,pObj,pCut_00);
    pCut_00->Delay = fVar6;
    fVar6 = If_CutAreaRefed(p,pCut_00);
    if ((fVar5 < fVar6) || (pObj->Required + p->fEpsilon < pCut_00->Delay)) {
      If_ManImproveNodeUpdate(p,pObj,vFrontOld);
      fVar6 = If_CutAreaRefed(p,pCut_00);
      if ((fVar6 != fVar5) || (NAN(fVar6) || NAN(fVar5))) {
        __assert_fail("AreaAft == AreaBef",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifReduce.c"
                      ,0xa6,
                      "void If_ManImproveNodeExpand(If_Man_t *, If_Obj_t *, int, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                     );
      }
      pCut_00->Delay = fVar4;
    }
  }
  return;
}

Assistant:

void If_ManImproveNodeExpand( If_Man_t * p, If_Obj_t * pObj, int nLimit, Vec_Ptr_t * vFront, Vec_Ptr_t * vFrontOld, Vec_Ptr_t * vVisited )
{
    If_Obj_t * pFanin;
    If_Cut_t * pCut;
    int CostBef, CostAft, i;
    float DelayOld, AreaBef, AreaAft;
    pCut = If_ObjCutBest(pObj);
    pCut->Delay = If_CutDelay( p, pObj, pCut );
    assert( pCut->Delay <= pObj->Required + p->fEpsilon );
    if ( pObj->nRefs == 0 )
        return;
    // get the delay
    DelayOld = pCut->Delay;
    // get the area
    AreaBef = If_CutAreaRefed( p, pCut );
//    if ( AreaBef == 1 )
//        return;
    // the cut is non-trivial
    If_ManImproveNodePrepare( p, pObj, nLimit, vFront, vFrontOld, vVisited );
    // iteratively modify the cut
    If_CutAreaDeref( p, pCut );
    CostBef = If_ManImproveCutCost( p, vFront );
    If_ManImproveNodeFaninCompact( p, pObj, nLimit, vFront, vVisited );
    CostAft = If_ManImproveCutCost( p, vFront );
    If_CutAreaRef( p, pCut );
    assert( CostBef >= CostAft );
    // clean up
    Vec_PtrForEachEntry( If_Obj_t *, vVisited, pFanin, i )
        pFanin->fMark = 0;
    // update the node
    If_ManImproveNodeUpdate( p, pObj, vFront );
    pCut->Delay = If_CutDelay( p, pObj, pCut );
    // get the new area
    AreaAft = If_CutAreaRefed( p, pCut );
    if ( AreaAft > AreaBef || pCut->Delay > pObj->Required + p->fEpsilon )
    {
        If_ManImproveNodeUpdate( p, pObj, vFrontOld );
        AreaAft = If_CutAreaRefed( p, pCut );
        assert( AreaAft == AreaBef );
        pCut->Delay = DelayOld;
    }
}